

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

CPubKey * AddrToPubKey(FillableSigningProvider *keystore,string *addr_in)

{
  bool bVar1;
  undefined1 uVar2;
  byte bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  undefined8 uVar5;
  long *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  CKeyID key;
  CTxDestination dest;
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  *in_stack_fffffffffffffe78;
  CTxDestination *in_stack_fffffffffffffe80;
  base_blob<160U> *in_stack_fffffffffffffe88;
  CPubKey *in_stack_fffffffffffffe90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  char *in_stack_fffffffffffffec0;
  int iVar6;
  SigningProvider *store;
  undefined1 local_8c [52];
  SigningProvider local_58 [10];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  store = local_58;
  pbVar4 = in_RDI;
  DecodeDestination(in_stack_fffffffffffffea0);
  bVar1 = IsValidDestination(in_stack_fffffffffffffe80);
  if (bVar1) {
    GetKeyForDestination(store,(CTxDestination *)pbVar4);
    uVar2 = base_blob<160U>::IsNull(in_stack_fffffffffffffe88);
    if ((bool)uVar2) {
      uVar5 = __cxa_allocate_exception(0x58);
      iVar6 = (int)((ulong)in_RDI >> 0x20);
      tinyformat::format<std::__cxx11::string>
                ((char *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
                 in_stack_fffffffffffffea0);
      JSONRPCError(iVar6,(string *)CONCAT17(uVar2,in_stack_fffffffffffffeb8));
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(uVar5,&UniValue::typeinfo,UniValue::~UniValue);
      }
    }
    else {
      CPubKey::CPubKey((CPubKey *)in_stack_fffffffffffffe78);
      bVar3 = (**(code **)(*in_RSI + 0x20))(in_RSI,local_8c,in_RDI);
      if ((bVar3 & 1) == 0) {
        pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __cxa_allocate_exception(0x58);
        iVar6 = (int)((ulong)in_RDI >> 0x20);
        tinyformat::format<std::__cxx11::string>
                  ((char *)CONCAT17(bVar3,in_stack_fffffffffffffea8),pbVar4);
        JSONRPCError(iVar6,(string *)CONCAT17(uVar2,in_stack_fffffffffffffeb8));
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          __cxa_throw(pbVar4,&UniValue::typeinfo,UniValue::~UniValue);
        }
      }
      else {
        bVar1 = CPubKey::IsFullyValid(in_stack_fffffffffffffe90);
        if (bVar1) {
          std::
          variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          ::~variant(in_stack_fffffffffffffe78);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            return (CPubKey *)pbVar4;
          }
        }
        else {
          uVar5 = __cxa_allocate_exception(0x58);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_RDI,in_stack_fffffffffffffec0,
                     (allocator<char> *)CONCAT17(uVar2,in_stack_fffffffffffffeb8));
          JSONRPCError((int)((ulong)in_RDI >> 0x20),
                       (string *)CONCAT17(uVar2,in_stack_fffffffffffffeb8));
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            __cxa_throw(uVar5,&UniValue::typeinfo,UniValue::~UniValue);
          }
        }
      }
    }
  }
  else {
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x58);
    std::operator+((char *)in_RDI,pbVar4);
    JSONRPCError((int)((ulong)in_RDI >> 0x20),
                 (string *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(pbVar4,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  __stack_chk_fail();
}

Assistant:

CPubKey AddrToPubKey(const FillableSigningProvider& keystore, const std::string& addr_in)
{
    CTxDestination dest = DecodeDestination(addr_in);
    if (!IsValidDestination(dest)) {
        throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Invalid address: " + addr_in);
    }
    CKeyID key = GetKeyForDestination(keystore, dest);
    if (key.IsNull()) {
        throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, strprintf("'%s' does not refer to a key", addr_in));
    }
    CPubKey vchPubKey;
    if (!keystore.GetPubKey(key, vchPubKey)) {
        throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, strprintf("no full public key for address %s", addr_in));
    }
    if (!vchPubKey.IsFullyValid()) {
       throw JSONRPCError(RPC_INTERNAL_ERROR, "Wallet contains an invalid public key");
    }
    return vchPubKey;
}